

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int fmt::v7::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char cVar3;
  buffer<char> *this;
  uint64_t divisor;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  result rVar7;
  type tVar8;
  decimal_fp<float> dVar9;
  undefined8 extraout_RDX;
  size_t count;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint64_t error;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  fp fVar17;
  fp fVar18;
  decimal_fp<double> dVar19;
  ulong uStack_a0;
  uint local_8c;
  fixed_handler handler;
  int cached_exp10;
  buffer<char> *local_60;
  ulong local_58;
  uint64_t local_50;
  double local_48;
  fp local_40;
  
  if (value < 0.0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                ,0x980,"value is negative");
  }
  uVar10 = (ulong)specs & 0xff00000000;
  bVar16 = uVar10 == 0x200000000;
  if (value <= 0.0) {
    if (precision < 1 || uVar10 != 0x200000000) {
      handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
      buffer<char>::push_back(buf,(char *)&handler);
      local_8c = 0;
    }
    else {
      tVar8 = to_unsigned<int>(precision);
      buffer<char>::try_resize(buf,(ulong)tVar8);
      memset(buf->ptr_,0x30,(ulong)(uint)precision);
      local_8c = -precision;
    }
  }
  else {
    uVar5 = specs._4_4_;
    if ((uVar5 >> 0x13 & 1) == 0) {
      iVar6 = snprintf_float<double>(value,precision,specs,buf);
      return iVar6;
    }
    if (precision < 0) {
      if ((uVar5 >> 0x12 & 1) == 0) {
        dVar19 = dragonbox::to_decimal<double>(value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)buf,dVar19.significand);
        local_8c = dVar19.exponent;
      }
      else {
        dVar9 = dragonbox::to_decimal<float>((float)value);
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)buf,dVar9.significand);
        local_8c = dVar9.exponent;
      }
    }
    else {
      cached_exp10 = 0;
      local_48 = value;
      fp::assign<double,_0>(&local_40,value);
      fVar17.f = (ulong)(uint)local_40.e;
      fVar17._8_8_ = extraout_RDX;
      fVar17 = normalize<0>((detail *)local_40.f,fVar17);
      local_60 = buf;
      fVar18 = get_cached_power(-0x7c - fVar17.e,&cached_exp10);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = fVar18.f;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar17.f;
      iVar6 = fVar18.e + fVar17.e;
      uVar14 = SUB168(auVar1 * auVar2,8) - (SUB168(auVar1 * auVar2,0) >> 0x3f);
      handler.buf = local_60->ptr_;
      handler.precision = 0x2ff;
      if ((uint)precision < 0x2ff) {
        handler.precision = precision;
      }
      uVar15 = (ulong)(uint)-iVar6;
      handler.size = 0;
      handler.exp10 = -cached_exp10;
      uVar13 = uVar14 >> (uVar15 & 0x3f);
      handler.fixed = bVar16;
      if ((uint32_t)uVar13 == 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                    ,0x5ec,"");
      }
      if (uVar13 >> 0x20 != 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                    ,0x5ed,"");
      }
      uVar11 = (ulong)(-iVar6 - 0x40);
      local_8c = count_digits((uint32_t)uVar13);
      rVar7 = fixed_handler::on_start
                        (&handler,*(long *)(basic_data<void>::grisu_pow10_exponents +
                                           (long)(int)local_8c * 8 + 0xa8) << (uVar11 & 0x3f),
                         uVar14 / 10,10,(int *)&local_8c);
      if (rVar7 == more) {
        local_50 = 1L << (uVar15 & 0x3f);
        local_58 = local_50 - 1;
        uVar14 = uVar14 & local_58;
        error = 1;
        do {
          uVar12 = local_8c - 1;
          switch((ulong)uVar12) {
          case 0:
            cVar3 = (char)uVar13;
            uVar13 = 0;
            goto LAB_00118f9c;
          case 1:
            uStack_a0 = 10;
            break;
          case 2:
            uStack_a0 = 100;
            break;
          case 3:
            uStack_a0 = 1000;
            break;
          case 4:
            uStack_a0 = 10000;
            break;
          case 5:
            uStack_a0 = 100000;
            break;
          case 6:
            uStack_a0 = 1000000;
            break;
          case 7:
            uStack_a0 = 10000000;
            break;
          case 8:
            uStack_a0 = 100000000;
            break;
          case 9:
            uStack_a0 = 1000000000;
            break;
          default:
            assert_fail("/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/external/fmt/include/fmt/format-inl.h"
                        ,0x61f,"invalid number of digits");
          }
          cVar3 = (char)((uVar13 & 0xffffffff) / uStack_a0);
          uVar13 = (uVar13 & 0xffffffff) % uStack_a0;
LAB_00118f9c:
          local_8c = uVar12;
          rVar7 = fixed_handler::on_digit
                            (&handler,cVar3 + '0',
                             *(long *)(basic_data<void>::powers_of_10_64 + (ulong)uVar12 * 8) <<
                             (uVar11 & 0x3f),(uVar13 << (uVar11 & 0x3f)) + uVar14,1,uVar12,true);
          divisor = local_50;
          if (rVar7 != more) goto LAB_00119031;
        } while (0 < (int)local_8c);
        do {
          uVar13 = uVar14 * 10;
          error = error * 10;
          uVar14 = uVar13 & local_58;
          local_8c = local_8c - 1;
          rVar7 = fixed_handler::on_digit
                            (&handler,(char)(uVar13 >> (uVar11 & 0x3f)) + '0',divisor,uVar14,error,
                             local_8c,false);
        } while (rVar7 == more);
      }
LAB_00119031:
      this = local_60;
      if (rVar7 == error) {
        local_8c = local_8c + ~cached_exp10 + handler.size;
        fallback_format<double>
                  (local_48,handler.precision,(bool)((byte)(uVar5 >> 0x12) & 1),local_60,
                   (int *)&local_8c);
      }
      else {
        local_8c = local_8c + handler.exp10;
        tVar8 = to_unsigned<int>(handler.size);
        buffer<char>::try_resize(this,(ulong)tVar8);
      }
      if ((uVar5 >> 0x14 & 1) == 0 && uVar10 != 0x200000000) {
        sVar4 = this->size_;
        uVar5 = local_8c;
        do {
          local_8c = uVar5;
          count = sVar4;
          if (count == 0) break;
          sVar4 = count - 1;
          uVar5 = local_8c + 1;
        } while (this->ptr_[count - 1] == '0');
        buffer<char>::try_resize(this,count);
      }
    }
  }
  return local_8c;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}